

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20.cpp
# Opt level: O2

void __thiscall ChaCha20::Crypt(ChaCha20 *this,Span<const_std::byte> input,Span<std::byte> output)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  byte *pbVar7;
  long in_FS_OFFSET;
  Span<const_std::byte> in_bytes;
  Span<std::byte> output_00;
  Span<std::byte> out_bytes;
  
  pbVar7 = output.m_data;
  uVar4 = input.m_size;
  pbVar5 = input.m_data;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (uVar4 != output.m_size) {
    __assert_fail("input.size() == output.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/crypto/chacha20.cpp"
                  ,0x131,"void ChaCha20::Crypt(Span<const std::byte>, Span<std::byte>)");
  }
  if (uVar4 != 0) {
    uVar6 = (ulong)this->m_bufleft;
    if (uVar6 != 0) {
      if (uVar4 <= uVar6) {
        uVar6 = uVar4;
      }
      for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
        pbVar7[uVar3] =
             (this->m_buffer)._M_elems[((int)uVar3 - this->m_bufleft) + 0x40] ^ pbVar5[uVar3];
      }
      this->m_bufleft = this->m_bufleft - (int)uVar6;
      pbVar7 = pbVar7 + uVar6;
      pbVar5 = pbVar5 + uVar6;
      uVar4 = uVar4 - uVar6;
    }
    if (0x3f < uVar4) {
      uVar6 = uVar4 & 0xffffffffffffffc0;
      in_bytes.m_size = uVar6;
      in_bytes.m_data = pbVar5;
      out_bytes.m_size = uVar6;
      out_bytes.m_data = pbVar7;
      ChaCha20Aligned::Crypt(&this->m_aligned,in_bytes,out_bytes);
      pbVar7 = pbVar7 + uVar6;
      pbVar5 = pbVar5 + uVar6;
      uVar4 = (ulong)((uint)uVar4 & 0x3f);
    }
    if (uVar4 != 0) {
      output_00.m_size = 0x40;
      output_00.m_data = (this->m_buffer)._M_elems;
      ChaCha20Aligned::Keystream(&this->m_aligned,output_00);
      for (lVar2 = 0; (uint)lVar2 < (uint)uVar4; lVar2 = lVar2 + 1) {
        pbVar7[lVar2] = (this->m_buffer)._M_elems[lVar2] ^ pbVar5[lVar2];
      }
      this->m_bufleft = 0x40 - (uint)uVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ChaCha20::Crypt(Span<const std::byte> input, Span<std::byte> output) noexcept
{
    assert(input.size() == output.size());

    if (!input.size()) return;
    if (m_bufleft) {
        unsigned reuse = std::min<size_t>(m_bufleft, input.size());
        for (unsigned i = 0; i < reuse; i++) {
            output[i] = input[i] ^ m_buffer[m_aligned.BLOCKLEN - m_bufleft + i];
        }
        m_bufleft -= reuse;
        output = output.subspan(reuse);
        input = input.subspan(reuse);
    }
    if (input.size() >= m_aligned.BLOCKLEN) {
        size_t blocks = input.size() / m_aligned.BLOCKLEN;
        m_aligned.Crypt(input.first(blocks * m_aligned.BLOCKLEN), output.first(blocks * m_aligned.BLOCKLEN));
        output = output.subspan(blocks * m_aligned.BLOCKLEN);
        input = input.subspan(blocks * m_aligned.BLOCKLEN);
    }
    if (!input.empty()) {
        m_aligned.Keystream(m_buffer);
        for (unsigned i = 0; i < input.size(); i++) {
            output[i] = input[i] ^ m_buffer[i];
        }
        m_bufleft = m_aligned.BLOCKLEN - input.size();
    }
}